

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

ArrayFeatureType_ShapeRange *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::ArrayFeatureType_ShapeRange>
          (Arena *arena)

{
  ArrayFeatureType_ShapeRange *this;
  
  if (arena == (Arena *)0x0) {
    this = (ArrayFeatureType_ShapeRange *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange
              (this,(Arena *)0x0,false);
  }
  else {
    this = (ArrayFeatureType_ShapeRange *)
           AllocateAlignedWithHook
                     (arena,0x30,
                      (type_info *)&CoreML::Specification::ArrayFeatureType_ShapeRange::typeinfo);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }